

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O0

bool __thiscall
sisl::array_n<float,_3,_std::allocator<float>_>::read_from_stream
          (array_n<float,_3,_std::allocator<float>_> *this,ifstream *stream)

{
  ulong uVar1;
  int local_38;
  int i;
  uint size;
  uint _in_dims [3];
  uint sig;
  ifstream *stream_local;
  array_n<float,_3,_std::allocator<float>_> *this_local;
  
  unique0x100000ea = stream;
  uVar1 = std::ios::good();
  if ((uVar1 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    _in_dims[1] = 0;
    std::istream::read((char *)stack0xffffffffffffffe0,(long)(_in_dims + 1));
    if (_in_dims[1] == 0x53534c41) {
      std::istream::read((char *)stack0xffffffffffffffe0,(long)&i);
      for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
        if ((&i)[local_38] != this->_dims[local_38]) {
          return false;
        }
      }
      std::istream::read((char *)stack0xffffffffffffffe0,(long)this->_array);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool read_from_stream(std::ifstream &stream) {
            if(!stream.good()) return false;

            unsigned int sig = 0;
            unsigned int _in_dims[N];
            unsigned int size = 1;

            stream.read((char *)&sig, sizeof(unsigned int));

            if(sig != 0x53534c41) return false;
            stream.read(( char *)&_in_dims[0], N*sizeof(unsigned int));

            for(int i = 0; i < N; i++) {
                if(_in_dims[i] != _dims[i]) return false;
                size *= _dims[i];
            }

            stream.read((char *)_array, size*sizeof(T));
            return true;
        }